

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::access_chain_internal_abi_cxx11_
          (CompilerGLSL *this,uint32_t base,uint32_t *indices,uint32_t count,AccessChainFlags flags,
          AccessChainMeta *meta)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  Types TVar4;
  CompilerError *pCVar5;
  long lVar6;
  size_t sVar7;
  mapped_type *pmVar8;
  string *psVar9;
  ulong uVar10;
  TypedID *this_00;
  SPIRType *pSVar11;
  char *pcVar12;
  Variant *this_01;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  CompilerGLSL *this_02;
  uint32_t *in_stack_00000008;
  byte local_561;
  allocator local_539;
  string local_538 [38];
  undefined1 local_512;
  allocator local_511;
  string local_510 [32];
  undefined1 local_4f0 [64];
  undefined1 local_4b0 [64];
  SPIRConstant *local_470;
  SPIRConstant *c;
  string local_460 [4];
  StorageClass effective_storage;
  long local_440;
  size_type column_index;
  string deferred_index;
  undefined1 local_418 [68];
  uint32_t local_3d4;
  string local_3d0 [32];
  undefined1 local_3b0 [68];
  TypeID local_36c;
  string local_368 [8];
  string qual_mbr_name;
  string local_348 [32];
  string local_328 [32];
  BuiltIn local_308;
  char local_302;
  allocator local_301;
  BuiltIn builtin_1;
  ID local_2dc;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [40];
  undefined1 local_290 [4];
  uint32_t j_1;
  spirv_cross local_270 [32];
  SPIRType *local_250;
  SPIRType *parent_type;
  spirv_cross local_228 [32];
  undefined1 local_208 [68];
  TypedID<(spirv_cross::Types)0> local_1c4;
  BuiltIn local_1c0;
  uint32_t local_1bc;
  BuiltIn builtin;
  SPIRVariable *var;
  undefined1 local_190 [40];
  undefined1 local_168 [4];
  uint32_t j;
  spirv_cross local_148 [39];
  byte local_121;
  uint local_120;
  uint uStack_11c;
  bool is_literal;
  uint32_t index;
  uint32_t i;
  anon_class_48_6_4d0f9c4a append_index;
  ID local_e0;
  bool dimension_flatten;
  bool pending_array_enclose;
  uint32_t local_d8;
  byte local_d3;
  byte local_d2;
  bool is_invariant;
  uint32_t physical_type;
  bool is_packed;
  bool row_major_matrix_needs_conversion;
  bool access_chain_is_arrayed;
  SPIRType *type;
  SPIRType *local_a8;
  SPIRType *type_1;
  string local_98 [36];
  uint32_t local_74;
  undefined1 local_70 [4];
  uint32_t type_id;
  byte local_4d;
  bool old_transpose;
  SPIRExpression *local_40;
  SPIRExpression *e;
  bool flatten_member_reference;
  bool register_expression_read;
  uint uStack_30;
  bool ptr_chain;
  bool chain_only;
  bool msb_is_id;
  bool index_is_literal;
  AccessChainFlags flags_local;
  uint32_t count_local;
  uint32_t *indices_local;
  CompilerGLSL *pCStack_18;
  uint32_t base_local;
  CompilerGLSL *this_local;
  string *expr;
  
  this_02 = (CompilerGLSL *)CONCAT44(in_register_00000034,base);
  _flags_local = (TypedID<(spirv_cross::Types)0> *)CONCAT44(in_register_0000000c,count);
  indices_local._4_4_ = (uint32_t)indices;
  uStack_30 = (uint)meta;
  e._7_1_ = 0;
  _chain_only = flags;
  pCStack_18 = this_02;
  this_local = this;
  ::std::__cxx11::string::string((string *)this);
  e._6_1_ = (uStack_30 & 1) != 0;
  e._5_1_ = (uStack_30 & 0x10) != 0;
  e._4_1_ = (uStack_30 & 2) != 0;
  e._3_1_ = (uStack_30 & 4) != 0;
  e._2_1_ = (uStack_30 & 8) == 0;
  e._1_1_ = (uStack_30 & 0x20) != 0;
  if (!(bool)e._4_1_) {
    local_40 = Compiler::maybe_get<spirv_cross::SPIRExpression>
                         ((Compiler *)this_02,indices_local._4_4_);
    local_561 = 0;
    if (local_40 != (SPIRExpression *)0x0) {
      local_561 = local_40->need_transpose;
    }
    local_4d = local_561 & 1;
    if (local_40 != (SPIRExpression *)0x0) {
      local_40->need_transpose = false;
    }
    to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_70,base,SUB41(indices_local._4_4_,0));
    ::std::__cxx11::string::operator=((string *)this,(string *)local_70);
    ::std::__cxx11::string::~string((string *)local_70);
    if (local_40 != (SPIRExpression *)0x0) {
      local_40->need_transpose = (bool)(local_4d & 1);
    }
  }
  local_74 = Compiler::expression_type_id((Compiler *)this_02,indices_local._4_4_);
  if (((this_02->backend).native_pointers & 1U) == 0) {
    if ((e._3_1_ & 1) != 0) {
      type_1._6_1_ = 1;
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_98,
                 "Backend does not support native pointers and does not support OpPtrAccessChain.",
                 (allocator *)((long)&type_1 + 7));
      CompilerError::CompilerError(pCVar5,(string *)local_98);
      type_1._6_1_ = 0;
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar1 = should_dereference(this_02,indices_local._4_4_);
    if (bVar1) {
      local_a8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,local_74);
      dereference_expression((CompilerGLSL *)&type,(SPIRType *)this_02,(string *)local_a8);
      ::std::__cxx11::string::operator=((string *)this,(string *)&type);
      ::std::__cxx11::string::~string((string *)&type);
    }
  }
  _physical_type = Compiler::get_pointee_type((Compiler *)this_02,local_74);
  lVar6 = ::std::__cxx11::string::find_first_of((char)this,0x5b);
  is_invariant = lVar6 != -1;
  iVar2 = (*(this_02->super_Compiler)._vptr_Compiler[0x25])(this_02,(ulong)indices_local._4_4_);
  local_d2 = (byte)iVar2 & 1;
  local_d3 = Compiler::has_extended_decoration
                       ((Compiler *)this_02,indices_local._4_4_,
                        SPIRVCrossDecorationPhysicalTypePacked);
  local_d8 = Compiler::get_extended_decoration
                       ((Compiler *)this_02,indices_local._4_4_,SPIRVCrossDecorationPhysicalTypeID);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_e0,indices_local._4_4_);
  pending_array_enclose = Compiler::has_decoration((Compiler *)this_02,local_e0,DecorationInvariant)
  ;
  append_index.access_chain_is_arrayed._7_1_ = 0;
  append_index.access_chain_is_arrayed._6_1_ = 0;
  _index = (__node_base_ptr)&stack0xffffffffffffffd0;
  append_index.expr = (string *)((long)&indices_local + 4);
  append_index.base = &physical_type;
  append_index.type = (SPIRType **)&is_invariant;
  uStack_11c = 0;
  append_index.flags = (AccessChainFlags *)this_02;
  append_index.this = this;
  do {
    if (_chain_only <= uStack_11c) {
      if ((append_index.access_chain_is_arrayed._7_1_ & 1) != 0) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_538,
                   "Flattening of multidimensional arrays were enabled, but the access chain was terminated in the middle of a multidimensional array. This is not supported."
                   ,&local_539);
        CompilerError::CompilerError(pCVar5,(string *)local_538);
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (in_stack_00000008 != (uint32_t *)0x0) {
        *(byte *)(in_stack_00000008 + 1) = local_d2 & 1;
        *(byte *)((long)in_stack_00000008 + 5) = local_d3 & 1;
        *(byte *)((long)in_stack_00000008 + 6) = pending_array_enclose & 1;
        *in_stack_00000008 = local_d8;
      }
      return this;
    }
    local_120 = _flags_local[uStack_11c].id;
    local_121 = e._6_1_ & 1;
    if (((local_121 != 0) && ((e._5_1_ & 1) != 0)) && ((int)local_120 < 0)) {
      local_121 = 0;
      local_120 = local_120 & 0x7fffffff;
    }
    if (((e._3_1_ & 1) == 0) || (uStack_11c != 0)) {
      bVar1 = VectorView<unsigned_int>::empty
                        (&(_physical_type->array).super_VectorView<unsigned_int>);
      if (bVar1) {
        if (*(int *)&(_physical_type->super_IVariant).field_0xc == 0xf) {
          if ((local_121 & 1) == 0) {
            local_120 = Compiler::evaluate_constant_u32((Compiler *)this_02,local_120);
          }
          uVar10 = (ulong)local_120;
          sVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            (&(_physical_type->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
          if (sVar7 <= uVar10) {
            local_302 = '\x01';
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&builtin_1,"Member index is out of bounds!",&local_301);
            CompilerError::CompilerError(pCVar5,(string *)&builtin_1);
            local_302 = '\0';
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          bVar1 = Compiler::is_member_builtin
                            ((Compiler *)this_02,_physical_type,local_120,&local_308);
          if (bVar1) {
            if ((is_invariant & 1U) == 0) {
              (*(this_02->super_Compiler)._vptr_Compiler[0x14])
                        (local_348,this_02,(ulong)local_308,(ulong)_physical_type->storage);
              ::std::__cxx11::string::operator=((string *)this,local_348);
              ::std::__cxx11::string::~string(local_348);
            }
            else {
              ::std::__cxx11::string::operator+=((string *)this,".");
              (*(this_02->super_Compiler)._vptr_Compiler[0x14])
                        (local_328,this_02,(ulong)local_308,(ulong)_physical_type->storage);
              ::std::__cxx11::string::operator+=((string *)this,local_328);
              ::std::__cxx11::string::~string(local_328);
            }
          }
          else {
            TypedID<(spirv_cross::Types)1>::TypedID(&local_36c,local_74);
            psVar9 = Compiler::get_member_qualified_name_abi_cxx11_
                               ((Compiler *)this_02,local_36c,local_120);
            ::std::__cxx11::string::string(local_368,(string *)psVar9);
            uVar10 = ::std::__cxx11::string::empty();
            if ((uVar10 & 1) == 0) {
              ::std::__cxx11::string::operator=((string *)this,local_368);
            }
            else if ((e._1_1_ & 1) == 0) {
              (*(this_02->super_Compiler)._vptr_Compiler[0x2a])
                        (local_3d0,this_02,(ulong)indices_local._4_4_,_physical_type,
                         (ulong)local_120,(ulong)(e._3_1_ & 1));
              ::std::__cxx11::string::operator+=((string *)this,local_3d0);
              ::std::__cxx11::string::~string(local_3d0);
            }
            else {
              to_member_name_abi_cxx11_
                        ((CompilerGLSL *)local_3b0,(SPIRType *)this_02,(uint32_t)_physical_type);
              join<char_const(&)[2],std::__cxx11::string>
                        ((spirv_cross *)(local_3b0 + 0x20),(char (*) [2])0x4e3b4c,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3b0);
              ::std::__cxx11::string::operator+=((string *)this,(string *)(local_3b0 + 0x20));
              ::std::__cxx11::string::~string((string *)(local_3b0 + 0x20));
              ::std::__cxx11::string::~string((string *)local_3b0);
            }
            ::std::__cxx11::string::~string(local_368);
          }
          local_3d4 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(_physical_type->super_IVariant).self);
          bVar1 = Compiler::has_member_decoration
                            ((Compiler *)this_02,(TypeID)local_3d4,local_120,DecorationInvariant);
          if (bVar1) {
            pending_array_enclose = true;
          }
          local_d3 = member_is_packed_physical_type(this_02,_physical_type,local_120);
          bVar1 = member_is_remapped_physical_type(this_02,_physical_type,local_120);
          if (bVar1) {
            uVar3 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(_physical_type->super_IVariant).self);
            local_d8 = Compiler::get_extended_member_decoration
                                 ((Compiler *)this_02,uVar3,local_120,
                                  SPIRVCrossDecorationPhysicalTypeID);
          }
          else {
            local_d8 = 0;
          }
          iVar2 = (*(this_02->super_Compiler)._vptr_Compiler[0x26])
                            (this_02,_physical_type,(ulong)local_120);
          local_d2 = (byte)iVar2 & 1;
          this_00 = (TypedID *)
                    VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              (&(_physical_type->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                               (ulong)local_120);
          uVar3 = TypedID::operator_cast_to_unsigned_int(this_00);
          _physical_type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,uVar3);
        }
        else if (_physical_type->columns < 2) {
          if (_physical_type->vecsize < 2) {
            if (((this_02->backend).allow_truncated_access_chain & 1U) == 0) {
              local_512 = 1;
              pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_510,"Cannot subdivide a scalar value!",&local_511);
              CompilerError::CompilerError(pCVar5,(string *)local_510);
              local_512 = 0;
              __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
          }
          else {
            ::std::__cxx11::string::string((string *)&column_index);
            if (((local_d2 & 1) != 0) &&
               (local_440 = ::std::__cxx11::string::find_last_of((char)this,0x5b), local_440 != -1))
            {
              ::std::__cxx11::string::substr((ulong)local_460,(ulong)this);
              ::std::__cxx11::string::operator=((string *)&column_index,local_460);
              ::std::__cxx11::string::~string(local_460);
              ::std::__cxx11::string::resize((ulong)this);
            }
            pSVar11 = Compiler::expression_type((Compiler *)this_02,indices_local._4_4_);
            if ((pSVar11->pointer & 1U) == 0) {
              c._4_4_ = StorageClassGeneric;
            }
            else {
              c._4_4_ = Compiler::get_expression_effective_storage_class
                                  ((Compiler *)this_02,indices_local._4_4_);
            }
            if ((local_d2 & 1) == 0) {
              uVar3 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&_physical_type->parent_type);
              pSVar11 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,uVar3);
              (*(this_02->super_Compiler)._vptr_Compiler[0x29])
                        (this_02,this,pSVar11,(ulong)c._4_4_,&local_d3);
            }
            if ((((local_121 & 1) == 0) || ((local_d3 & 1) != 0)) || ((local_d2 & 1) != 0)) {
              this_01 = VectorView<spirv_cross::Variant>::operator[]
                                  (&(this_02->super_Compiler).ir.ids.
                                    super_VectorView<spirv_cross::Variant>,(ulong)local_120);
              TVar4 = Variant::get_type(this_01);
              if (((TVar4 == TypeConstant) && ((local_d3 & 1) == 0)) && ((local_d2 & 1) == 0)) {
                local_470 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this_02,local_120);
                if ((local_470->specialization & 1U) == 0) {
                  ::std::__cxx11::string::operator+=((string *)this,".");
                  uVar3 = SPIRConstant::scalar(local_470,0,0);
                  pcVar12 = index_to_swizzle(this_02,uVar3);
                  ::std::__cxx11::string::operator+=((string *)this,pcVar12);
                }
                else {
                  to_expression_abi_cxx11_((CompilerGLSL *)local_4b0,base,SUB41(local_120,0));
                  join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                            ((spirv_cross *)(local_4b0 + 0x20),(char (*) [2])0x4f1699,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4b0,(char (*) [2])0x4e3676);
                  ::std::__cxx11::string::operator+=((string *)this,(string *)(local_4b0 + 0x20));
                  ::std::__cxx11::string::~string((string *)(local_4b0 + 0x20));
                  ::std::__cxx11::string::~string((string *)local_4b0);
                }
              }
              else if ((local_121 & 1) == 0) {
                ::std::__cxx11::string::operator+=((string *)this,"[");
                to_expression_abi_cxx11_((CompilerGLSL *)local_4f0,base,SUB41(local_120,0));
                ::std::__cxx11::string::operator+=((string *)this,(string *)local_4f0);
                ::std::__cxx11::string::~string((string *)local_4f0);
                ::std::__cxx11::string::operator+=((string *)this,"]");
              }
              else {
                join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                          ((spirv_cross *)(local_4f0 + 0x20),(char (*) [2])0x4f1699,&local_120,
                           (char (*) [2])0x4e3676);
                ::std::__cxx11::string::operator+=((string *)this,(string *)(local_4f0 + 0x20));
                ::std::__cxx11::string::~string((string *)(local_4f0 + 0x20));
              }
            }
            else {
              ::std::__cxx11::string::operator+=((string *)this,".");
              pcVar12 = index_to_swizzle(this_02,local_120);
              ::std::__cxx11::string::operator+=((string *)this,pcVar12);
            }
            if ((local_d2 & 1) != 0) {
              uVar3 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&_physical_type->parent_type);
              pSVar11 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,uVar3);
              (*(this_02->super_Compiler)._vptr_Compiler[0x29])
                        (this_02,this,pSVar11,(ulong)c._4_4_,&local_d3);
            }
            ::std::__cxx11::string::operator+=((string *)this,(string *)&column_index);
            local_d2 = 0;
            local_d3 = 0;
            local_d8 = 0;
            local_74 = TypedID::operator_cast_to_unsigned_int
                                 ((TypedID *)&_physical_type->parent_type);
            _physical_type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,local_74);
            ::std::__cxx11::string::~string((string *)&column_index);
          }
        }
        else {
          ::std::__cxx11::string::operator+=((string *)this,"[");
          if ((local_121 & 1) == 0) {
            to_expression_abi_cxx11_((CompilerGLSL *)local_418,base,SUB41(local_120,0));
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_418);
            ::std::__cxx11::string::~string((string *)local_418);
          }
          else {
            convert_to_string<unsigned_int,_0>((spirv_cross *)(local_418 + 0x20),&local_120);
            ::std::__cxx11::string::operator+=((string *)this,(string *)(local_418 + 0x20));
            ::std::__cxx11::string::~string((string *)(local_418 + 0x20));
          }
          ::std::__cxx11::string::operator+=((string *)this,"]");
          local_74 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_physical_type->parent_type)
          ;
          _physical_type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,local_74);
        }
      }
      else {
        if ((((this_02->options).flatten_multidimensional_arrays & 1U) != 0) &&
           ((append_index.access_chain_is_arrayed._7_1_ & 1) == 0)) {
          sVar7 = VectorView<unsigned_int>::size
                            (&(_physical_type->array).super_VectorView<unsigned_int>);
          append_index.access_chain_is_arrayed._6_1_ = 1 < sVar7;
          append_index.access_chain_is_arrayed._7_1_ = append_index.access_chain_is_arrayed._6_1_;
          if ((bool)append_index.access_chain_is_arrayed._6_1_) {
            ::std::__cxx11::string::operator+=((string *)this,"[");
          }
        }
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_physical_type->parent_type);
        if (uVar3 == 0) {
          __assert_fail("type->parent_type",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                        ,0x1fcd,
                        "string spirv_cross::CompilerGLSL::access_chain_internal(uint32_t, const uint32_t *, uint32_t, AccessChainFlags, AccessChainMeta *)"
                       );
        }
        _builtin = Compiler::maybe_get<spirv_cross::SPIRVariable>
                             ((Compiler *)this_02,indices_local._4_4_);
        if ((((((this_02->backend).force_gl_in_out_block & 1U) == 0) || (uStack_11c != 0)) ||
            (_builtin == (SPIRVariable *)0x0)) ||
           (bVar1 = Compiler::is_builtin_variable((Compiler *)this_02,_builtin), !bVar1)) {
LAB_002f02de:
          if ((((this_02->options).flatten_multidimensional_arrays & 1U) == 0) ||
             ((append_index.access_chain_is_arrayed._6_1_ & 1) == 0)) {
            TypedID<(spirv_cross::Types)0>::TypedID(&local_2dc,indices_local._4_4_);
            uVar3 = Compiler::get_decoration((Compiler *)this_02,local_2dc,DecorationBuiltIn);
            iVar2 = (*(this_02->super_Compiler)._vptr_Compiler[0x22])(this_02,(ulong)uVar3);
            if ((((byte)iVar2 ^ 0xff) & 1) != 0) {
              access_chain_internal::anon_class_48_6_4d0f9c4a::operator()
                        ((anon_class_48_6_4d0f9c4a *)&index,local_120,(bool)(local_121 & 1));
            }
          }
          else {
            uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_physical_type->parent_type);
            local_250 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,uVar3);
            if ((local_121 & 1) == 0) {
              to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_290,base,SUB41(local_120,0));
              ::std::__cxx11::string::operator+=((string *)this,(string *)local_290);
              ::std::__cxx11::string::~string((string *)local_290);
            }
            else {
              convert_to_string<unsigned_int,_0>(local_270,&local_120);
              ::std::__cxx11::string::operator+=((string *)this,(string *)local_270);
              ::std::__cxx11::string::~string((string *)local_270);
            }
            sVar7 = VectorView<unsigned_int>::size
                              (&(local_250->array).super_VectorView<unsigned_int>);
            for (local_2b8._36_4_ = (undefined4)sVar7; local_2b8._36_4_ != 0;
                local_2b8._36_4_ = local_2b8._36_4_ + -1) {
              ::std::__cxx11::string::operator+=((string *)this," * ");
              to_array_size_abi_cxx11_
                        ((CompilerGLSL *)local_2d8,(SPIRType *)this_02,(uint32_t)local_250);
              enclose_expression((CompilerGLSL *)local_2b8,(string *)this_02);
              ::std::__cxx11::string::operator+=((string *)this,(string *)local_2b8);
              ::std::__cxx11::string::~string((string *)local_2b8);
              ::std::__cxx11::string::~string((string *)local_2d8);
            }
            bVar1 = VectorView<unsigned_int>::empty
                              (&(local_250->array).super_VectorView<unsigned_int>);
            if (bVar1) {
              append_index.access_chain_is_arrayed._7_1_ = 0;
            }
            else {
              ::std::__cxx11::string::operator+=((string *)this," + ");
            }
            if ((append_index.access_chain_is_arrayed._7_1_ & 1) == 0) {
              ::std::__cxx11::string::operator+=((string *)this,"]");
            }
          }
        }
        else {
          local_1bc = (_physical_type->super_IVariant).self.id;
          bVar1 = Compiler::has_decoration((Compiler *)this_02,(ID)local_1bc,DecorationBlock);
          if (bVar1) goto LAB_002f02de;
          TypedID<(spirv_cross::Types)0>::TypedID(&local_1c4,indices_local._4_4_);
          pmVar8 = ::std::
                   unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                   ::operator[](&(this_02->super_Compiler).ir.meta,&local_1c4);
          local_1c0 = (pmVar8->decoration).builtin_type;
          if (local_1c0 < 2) {
            if (_builtin->storage == StorageClassInput) {
              to_expression_abi_cxx11_((CompilerGLSL *)local_208,base,SUB41(local_120,0));
              join<char_const(&)[7],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                        ((spirv_cross *)(local_208 + 0x20),(char (*) [7])"gl_in[",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208,(char (*) [3])0x4e03c2,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
              ::std::__cxx11::string::operator=((string *)this,(string *)(local_208 + 0x20));
              ::std::__cxx11::string::~string((string *)(local_208 + 0x20));
              ::std::__cxx11::string::~string((string *)local_208);
            }
            else if (_builtin->storage == StorageClassOutput) {
              to_expression_abi_cxx11_((CompilerGLSL *)&parent_type,base,SUB41(local_120,0));
              join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                        (local_228,(char (*) [8])"gl_out[",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parent_type,(char (*) [3])0x4e03c2,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
              ::std::__cxx11::string::operator=((string *)this,(string *)local_228);
              ::std::__cxx11::string::~string((string *)local_228);
              ::std::__cxx11::string::~string((string *)&parent_type);
            }
            else {
              access_chain_internal::anon_class_48_6_4d0f9c4a::operator()
                        ((anon_class_48_6_4d0f9c4a *)&index,local_120,(bool)(local_121 & 1));
            }
          }
          else {
            access_chain_internal::anon_class_48_6_4d0f9c4a::operator()
                      ((anon_class_48_6_4d0f9c4a *)&index,local_120,(bool)(local_121 & 1));
          }
        }
        local_74 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_physical_type->parent_type);
        _physical_type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,local_74);
        is_invariant = true;
      }
    }
    else {
      if (((this_02->options).flatten_multidimensional_arrays & 1U) != 0) {
        sVar7 = VectorView<unsigned_int>::size
                          (&(_physical_type->array).super_VectorView<unsigned_int>);
        append_index.access_chain_is_arrayed._6_1_ = sVar7 != 0;
        append_index.access_chain_is_arrayed._7_1_ = append_index.access_chain_is_arrayed._6_1_;
        if ((bool)append_index.access_chain_is_arrayed._6_1_) {
          ::std::__cxx11::string::operator+=((string *)this,"[");
        }
      }
      if ((((this_02->options).flatten_multidimensional_arrays & 1U) == 0) ||
         ((append_index.access_chain_is_arrayed._6_1_ & 1) == 0)) {
        access_chain_internal::anon_class_48_6_4d0f9c4a::operator()
                  ((anon_class_48_6_4d0f9c4a *)&index,local_120,(bool)(local_121 & 1));
      }
      else {
        if ((local_121 & 1) == 0) {
          to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_168,base,SUB41(local_120,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_168);
          ::std::__cxx11::string::~string((string *)local_168);
        }
        else {
          convert_to_string<unsigned_int,_0>(local_148,&local_120);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_148);
          ::std::__cxx11::string::~string((string *)local_148);
        }
        sVar7 = VectorView<unsigned_int>::size
                          (&(_physical_type->array).super_VectorView<unsigned_int>);
        for (local_190._36_4_ = (undefined4)sVar7; local_190._36_4_ != 0;
            local_190._36_4_ = local_190._36_4_ + -1) {
          ::std::__cxx11::string::operator+=((string *)this," * ");
          to_array_size_abi_cxx11_
                    ((CompilerGLSL *)&var,(SPIRType *)this_02,(uint32_t)_physical_type);
          enclose_expression((CompilerGLSL *)local_190,(string *)this_02);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_190);
          ::std::__cxx11::string::~string((string *)local_190);
          ::std::__cxx11::string::~string((string *)&var);
        }
        bVar1 = VectorView<unsigned_int>::empty
                          (&(_physical_type->array).super_VectorView<unsigned_int>);
        if (bVar1) {
          append_index.access_chain_is_arrayed._7_1_ = 0;
        }
        else {
          ::std::__cxx11::string::operator+=((string *)this," + ");
        }
        if ((append_index.access_chain_is_arrayed._7_1_ & 1) == 0) {
          ::std::__cxx11::string::operator+=((string *)this,"]");
        }
      }
      if (*(int *)&(_physical_type->super_IVariant).field_0xc == 0x15) {
        local_74 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_physical_type->parent_type);
        _physical_type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,local_74);
      }
      is_invariant = true;
    }
    uStack_11c = uStack_11c + 1;
  } while( true );
}

Assistant:

string CompilerGLSL::access_chain_internal(uint32_t base, const uint32_t *indices, uint32_t count,
                                           AccessChainFlags flags, AccessChainMeta *meta)
{
	string expr;

	bool index_is_literal = (flags & ACCESS_CHAIN_INDEX_IS_LITERAL_BIT) != 0;
	bool msb_is_id = (flags & ACCESS_CHAIN_LITERAL_MSB_FORCE_ID) != 0;
	bool chain_only = (flags & ACCESS_CHAIN_CHAIN_ONLY_BIT) != 0;
	bool ptr_chain = (flags & ACCESS_CHAIN_PTR_CHAIN_BIT) != 0;
	bool register_expression_read = (flags & ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT) == 0;
	bool flatten_member_reference = (flags & ACCESS_CHAIN_FLATTEN_ALL_MEMBERS_BIT) != 0;

	if (!chain_only)
	{
		// We handle transpose explicitly, so don't resolve that here.
		auto *e = maybe_get<SPIRExpression>(base);
		bool old_transpose = e && e->need_transpose;
		if (e)
			e->need_transpose = false;
		expr = to_enclosed_expression(base, register_expression_read);
		if (e)
			e->need_transpose = old_transpose;
	}

	// Start traversing type hierarchy at the proper non-pointer types,
	// but keep type_id referencing the original pointer for use below.
	uint32_t type_id = expression_type_id(base);

	if (!backend.native_pointers)
	{
		if (ptr_chain)
			SPIRV_CROSS_THROW("Backend does not support native pointers and does not support OpPtrAccessChain.");

		// Wrapped buffer reference pointer types will need to poke into the internal "value" member before
		// continuing the access chain.
		if (should_dereference(base))
		{
			auto &type = get<SPIRType>(type_id);
			expr = dereference_expression(type, expr);
		}
	}

	const auto *type = &get_pointee_type(type_id);

	bool access_chain_is_arrayed = expr.find_first_of('[') != string::npos;
	bool row_major_matrix_needs_conversion = is_non_native_row_major_matrix(base);
	bool is_packed = has_extended_decoration(base, SPIRVCrossDecorationPhysicalTypePacked);
	uint32_t physical_type = get_extended_decoration(base, SPIRVCrossDecorationPhysicalTypeID);
	bool is_invariant = has_decoration(base, DecorationInvariant);
	bool pending_array_enclose = false;
	bool dimension_flatten = false;

	const auto append_index = [&](uint32_t index, bool is_literal) {
		AccessChainFlags mod_flags = flags;
		if (!is_literal)
			mod_flags &= ~ACCESS_CHAIN_INDEX_IS_LITERAL_BIT;
		access_chain_internal_append_index(expr, base, type, mod_flags, access_chain_is_arrayed, index);
	};

	for (uint32_t i = 0; i < count; i++)
	{
		uint32_t index = indices[i];

		bool is_literal = index_is_literal;
		if (is_literal && msb_is_id && (index >> 31u) != 0u)
		{
			is_literal = false;
			index &= 0x7fffffffu;
		}

		// Pointer chains
		if (ptr_chain && i == 0)
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays)
			{
				dimension_flatten = type->array.size() >= 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(type->array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(*type, j - 1));
				}

				if (type->array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			else
			{
				append_index(index, is_literal);
			}

			if (type->basetype == SPIRType::ControlPointArray)
			{
				type_id = type->parent_type;
				type = &get<SPIRType>(type_id);
			}

			access_chain_is_arrayed = true;
		}
		// Arrays
		else if (!type->array.empty())
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays && !pending_array_enclose)
			{
				dimension_flatten = type->array.size() > 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			assert(type->parent_type);

			auto *var = maybe_get<SPIRVariable>(base);
			if (backend.force_gl_in_out_block && i == 0 && var && is_builtin_variable(*var) &&
			    !has_decoration(type->self, DecorationBlock))
			{
				// This deals with scenarios for tesc/geom where arrays of gl_Position[] are declared.
				// Normally, these variables live in blocks when compiled from GLSL,
				// but HLSL seems to just emit straight arrays here.
				// We must pretend this access goes through gl_in/gl_out arrays
				// to be able to access certain builtins as arrays.
				auto builtin = ir.meta[base].decoration.builtin_type;
				switch (builtin)
				{
				// case BuiltInCullDistance: // These are already arrays, need to figure out rules for these in tess/geom.
				// case BuiltInClipDistance:
				case BuiltInPosition:
				case BuiltInPointSize:
					if (var->storage == StorageClassInput)
						expr = join("gl_in[", to_expression(index, register_expression_read), "].", expr);
					else if (var->storage == StorageClassOutput)
						expr = join("gl_out[", to_expression(index, register_expression_read), "].", expr);
					else
						append_index(index, is_literal);
					break;

				default:
					append_index(index, is_literal);
					break;
				}
			}
			else if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				auto &parent_type = get<SPIRType>(type->parent_type);

				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(parent_type.array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(parent_type, j - 1));
				}

				if (parent_type.array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			// Some builtins are arrays in SPIR-V but not in other languages, e.g. gl_SampleMask[] is an array in SPIR-V but not in Metal.
			// By throwing away the index, we imply the index was 0, which it must be for gl_SampleMask.
			else if (!builtin_translates_to_nonarray(BuiltIn(get_decoration(base, DecorationBuiltIn))))
			{
				append_index(index, is_literal);
			}

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);

			access_chain_is_arrayed = true;
		}
		// For structs, the index refers to a constant, which indexes into the members.
		// We also check if this member is a builtin, since we then replace the entire expression with the builtin one.
		else if (type->basetype == SPIRType::Struct)
		{
			if (!is_literal)
				index = evaluate_constant_u32(index);

			if (index >= type->member_types.size())
				SPIRV_CROSS_THROW("Member index is out of bounds!");

			BuiltIn builtin;
			if (is_member_builtin(*type, index, &builtin))
			{
				if (access_chain_is_arrayed)
				{
					expr += ".";
					expr += builtin_to_glsl(builtin, type->storage);
				}
				else
					expr = builtin_to_glsl(builtin, type->storage);
			}
			else
			{
				// If the member has a qualified name, use it as the entire chain
				string qual_mbr_name = get_member_qualified_name(type_id, index);
				if (!qual_mbr_name.empty())
					expr = qual_mbr_name;
				else if (flatten_member_reference)
					expr += join("_", to_member_name(*type, index));
				else
					expr += to_member_reference(base, *type, index, ptr_chain);
			}

			if (has_member_decoration(type->self, index, DecorationInvariant))
				is_invariant = true;

			is_packed = member_is_packed_physical_type(*type, index);
			if (member_is_remapped_physical_type(*type, index))
				physical_type = get_extended_member_decoration(type->self, index, SPIRVCrossDecorationPhysicalTypeID);
			else
				physical_type = 0;

			row_major_matrix_needs_conversion = member_is_non_native_row_major_matrix(*type, index);
			type = &get<SPIRType>(type->member_types[index]);
		}
		// Matrix -> Vector
		else if (type->columns > 1)
		{
			// If we have a row-major matrix here, we need to defer any transpose in case this access chain
			// is used to store a column. We can resolve it right here and now if we access a scalar directly,
			// by flipping indexing order of the matrix.

			expr += "[";
			if (is_literal)
				expr += convert_to_string(index);
			else
				expr += to_expression(index, register_expression_read);
			expr += "]";

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		// Vector -> Scalar
		else if (type->vecsize > 1)
		{
			string deferred_index;
			if (row_major_matrix_needs_conversion)
			{
				// Flip indexing order.
				auto column_index = expr.find_last_of('[');
				if (column_index != string::npos)
				{
					deferred_index = expr.substr(column_index);
					expr.resize(column_index);
				}
			}

			// Internally, access chain implementation can also be used on composites,
			// ignore scalar access workarounds in this case.
			StorageClass effective_storage;
			if (expression_type(base).pointer)
				effective_storage = get_expression_effective_storage_class(base);
			else
				effective_storage = StorageClassGeneric;

			if (!row_major_matrix_needs_conversion)
			{
				// On some backends, we might not be able to safely access individual scalars in a vector.
				// To work around this, we might have to cast the access chain reference to something which can,
				// like a pointer to scalar, which we can then index into.
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			if (is_literal && !is_packed && !row_major_matrix_needs_conversion)
			{
				expr += ".";
				expr += index_to_swizzle(index);
			}
			else if (ir.ids[index].get_type() == TypeConstant && !is_packed && !row_major_matrix_needs_conversion)
			{
				auto &c = get<SPIRConstant>(index);
				if (c.specialization)
				{
					// If the index is a spec constant, we cannot turn extract into a swizzle.
					expr += join("[", to_expression(index), "]");
				}
				else
				{
					expr += ".";
					expr += index_to_swizzle(c.scalar());
				}
			}
			else if (is_literal)
			{
				// For packed vectors, we can only access them as an array, not by swizzle.
				expr += join("[", index, "]");
			}
			else
			{
				expr += "[";
				expr += to_expression(index, register_expression_read);
				expr += "]";
			}

			if (row_major_matrix_needs_conversion)
			{
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			expr += deferred_index;
			row_major_matrix_needs_conversion = false;

			is_packed = false;
			physical_type = 0;
			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		else if (!backend.allow_truncated_access_chain)
			SPIRV_CROSS_THROW("Cannot subdivide a scalar value!");
	}

	if (pending_array_enclose)
	{
		SPIRV_CROSS_THROW("Flattening of multidimensional arrays were enabled, "
		                  "but the access chain was terminated in the middle of a multidimensional array. "
		                  "This is not supported.");
	}

	if (meta)
	{
		meta->need_transpose = row_major_matrix_needs_conversion;
		meta->storage_is_packed = is_packed;
		meta->storage_is_invariant = is_invariant;
		meta->storage_physical_type = physical_type;
	}

	return expr;
}